

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O0

void __thiscall Lock::~Lock(Lock *this)

{
  Keygroup *this_00;
  uint uVar1;
  Keygroup **ppKVar2;
  uint local_14;
  uint i;
  Lock *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<Keygroup_*,_Keygroup_*>::Size(&this->keylist);
    if (uVar1 <= local_14) break;
    ppKVar2 = TArray<Keygroup_*,_Keygroup_*>::operator[](&this->keylist,(ulong)local_14);
    this_00 = *ppKVar2;
    if (this_00 != (Keygroup *)0x0) {
      Keygroup::~Keygroup(this_00);
      operator_delete(this_00,0x10);
    }
    local_14 = local_14 + 1;
  }
  TArray<Keygroup_*,_Keygroup_*>::Clear(&this->keylist);
  FString::~FString(&this->RemoteMsg);
  FString::~FString(&this->Message);
  TArray<FSoundID,_FSoundID>::~TArray(&this->locksound);
  TArray<Keygroup_*,_Keygroup_*>::~TArray(&this->keylist);
  return;
}

Assistant:

~Lock()
	{
		for(unsigned int i=0;i<keylist.Size();i++) delete keylist[i];
		keylist.Clear();
	}